

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUITabControl * __thiscall
irr::gui::CGUIEnvironment::addTabControl
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,bool fillbackground,
          bool border,s32 id)

{
  CGUITabControl *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUITabControl *)operator_new(0x1a0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUITabControl::CGUITabControl
            (this_00,&this->super_IGUIEnvironment,parent_00,rectangle,fillbackground,border,id);
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUITabControl *)this_00;
}

Assistant:

IGUITabControl *CGUIEnvironment::addTabControl(const core::rect<s32> &rectangle,
		IGUIElement *parent, bool fillbackground, bool border, s32 id)
{
	IGUITabControl *t = new CGUITabControl(this, parent ? parent : this,
			rectangle, fillbackground, border, id);
	t->drop();
	return t;
}